

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall embree::Scene::createUserGeometryAccel(Scene *this)

{
  State *this_00;
  long lVar1;
  bool bVar2;
  Accel *accel;
  undefined8 *puVar3;
  BuildVariant BVar4;
  BVH4Factory *this_01;
  BVH8Factory *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(this->super_AccelN).field_0x188 + 0x310),"default");
  this_00 = *(State **)&(this->super_AccelN).field_0x188;
  if (bVar2) {
    bVar2 = State::canUseAVX(this_00);
    if ((!bVar2) || ((this->scene_flags & RTC_SCENE_FLAG_COMPACT) != RTC_SCENE_FLAG_NONE)) {
      this_01 = *(BVH4Factory **)(*(long *)&(this->super_AccelN).field_0x188 + 0x560);
      if (this->quality_flags != RTC_BUILD_QUALITY_LOW) goto LAB_001ab6ad;
      BVar4 = DYNAMIC;
LAB_001ab6eb:
      accel = BVH4Factory::BVH4UserGeometry(this_01,this,BVar4);
      goto LAB_001ab6f0;
    }
    this_02 = *(BVH8Factory **)(*(long *)&(this->super_AccelN).field_0x188 + 0x568);
    if (this->quality_flags != RTC_BUILD_QUALITY_LOW) goto LAB_001ab6d9;
    BVar4 = DYNAMIC;
  }
  else {
    bVar2 = std::operator==(&this_00->object_accel,"bvh4.object");
    lVar1 = *(long *)&(this->super_AccelN).field_0x188;
    if (bVar2) {
      this_01 = *(BVH4Factory **)(lVar1 + 0x560);
LAB_001ab6ad:
      BVar4 = STATIC;
      goto LAB_001ab6eb;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar1 + 0x310),"bvh8.object");
    if (!bVar2) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::operator+(&bStack_38,"unknown user geometry accel ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)&(this->super_AccelN).field_0x188 + 0x310));
      *puVar3 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar3 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar3 + 2),(string *)&bStack_38);
      __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    this_02 = *(BVH8Factory **)(*(long *)&(this->super_AccelN).field_0x188 + 0x568);
LAB_001ab6d9:
    BVar4 = STATIC;
  }
  accel = BVH8Factory::BVH8UserGeometry(this_02,this,BVar4);
LAB_001ab6f0:
  AccelN::accels_add(&this->super_AccelN,accel);
  return;
}

Assistant:

void Scene::createUserGeometryAccel()
  {
#if defined(EMBREE_GEOMETRY_USER)

    if (device->object_accel == "default")
    {
#if defined (EMBREE_TARGET_SIMD8)
      if (device->canUseAVX() && !isCompactAccel())
      {
        if (quality_flags != RTC_BUILD_QUALITY_LOW) {
          accels_add(device->bvh8_factory->BVH8UserGeometry(this,BVHFactory::BuildVariant::STATIC));
        } else {
          accels_add(device->bvh8_factory->BVH8UserGeometry(this,BVHFactory::BuildVariant::DYNAMIC));
        }
      }
      else
#endif
      {
        if (quality_flags != RTC_BUILD_QUALITY_LOW) {
          accels_add(device->bvh4_factory->BVH4UserGeometry(this,BVHFactory::BuildVariant::STATIC));
        } else {
          accels_add(device->bvh4_factory->BVH4UserGeometry(this,BVHFactory::BuildVariant::DYNAMIC));
        }
      }
    }
    else if (device->object_accel == "bvh4.object") accels_add(device->bvh4_factory->BVH4UserGeometry(this));
#if defined (EMBREE_TARGET_SIMD8)
    else if (device->object_accel == "bvh8.object") accels_add(device->bvh8_factory->BVH8UserGeometry(this));
#endif
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown user geometry accel "+device->object_accel);
#endif
  }